

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_btst_8_r_pcix(void)

{
  uint uVar1;
  
  uVar1 = OPER_PCIX_8();
  m68ki_cpu.not_z_flag = uVar1 & 1 << ((byte)m68ki_cpu.dar[m68ki_cpu.ir >> 9 & 7] & 7);
  return;
}

Assistant:

static void m68k_op_btst_8_r_pcix(void)
{
	FLAG_Z = OPER_PCIX_8() & (1 << (DX & 7));
}